

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::build(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
        *this)

{
  bool bVar1;
  ObserverBase *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  *in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  int local_20;
  Arc local_18;
  Arc local_14;
  Notifier *local_10;
  
  local_10 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
             ::ObserverBase::notifier(in_RDI);
  allocate_memory((ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
                   *)in_stack_ffffffffffffffb0);
  SmartDigraphBase::Arc::Arc(&local_14);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::first(in_stack_ffffffffffffffb0,(Item *)in_stack_ffffffffffffffa8);
  while( true ) {
    SmartDigraphBase::Arc::Arc(&local_18);
    bVar1 = SmartDigraphBase::Arc::operator!=(&local_14,local_18);
    if (!bVar1) break;
    local_20 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
               ::id(in_stack_ffffffffffffffb0,(Item *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
          *)&in_RDI[1]._index;
    memset(local_38,0,0x18);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x2b78b7);
    std::allocator_traits<std::allocator<std::vector<double,std::allocator<double>>>>::
    construct<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              ((allocator_type *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (vector<double,_std::allocator<double>_> *)0x2b78cb);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
    ::next(in_stack_ffffffffffffffb0,(Item *)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

virtual void build() {
    Notifier* nf = Parent::notifier();
    allocate_memory();
    Item it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }